

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-workload-benchmark.cpp
# Opt level: O2

void workload_unrollaccum8(vector<float,_std::allocator<float>_> *data,float *result)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  pointer pfVar6;
  long lVar7;
  ulong uVar8;
  size_t i;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  pfVar6 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar8 = (long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar6;
  if ((uVar8 & 0x1c) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR in ");
    poVar5 = std::operator<<(poVar5,"workload_unrollaccum8");
    poVar5 = std::operator<<(poVar5,": data.size ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"\n");
    pfVar6 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar6;
  }
  fVar14 = 0.0;
  fVar15 = 0.0;
  fVar16 = 0.0;
  fVar17 = 0.0;
  fVar10 = 0.0;
  fVar11 = 0.0;
  fVar12 = 0.0;
  fVar13 = 0.0;
  for (uVar9 = 0; uVar9 < (ulong)((long)uVar8 >> 2); uVar9 = uVar9 + 8) {
    pfVar1 = pfVar6 + uVar9;
    pfVar2 = pfVar6 + uVar9 + 4;
    fVar10 = fVar10 + *pfVar2;
    fVar11 = fVar11 + pfVar2[1];
    fVar12 = fVar12 + pfVar2[2];
    fVar13 = fVar13 + pfVar2[3];
    fVar14 = fVar14 + *pfVar1;
    fVar15 = fVar15 + pfVar1[1];
    fVar16 = fVar16 + pfVar1[2];
    fVar17 = fVar17 + pfVar1[3];
  }
  *result = fVar13 + fVar12 + fVar11 + fVar17 + fVar16 + fVar15 + fVar14 + fVar10;
  lVar7 = std::chrono::_V2::system_clock::now();
  std::mutex::lock(&iomutex);
  poVar5 = std::operator<<((ostream *)&std::cout,"workload_unrollaccum8");
  poVar5 = std::operator<<(poVar5," [cpu ");
  iVar3 = sched_getcpu();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::operator<<(poVar5,"]:\n");
  poVar5 = std::operator<<((ostream *)&std::cout,"  processed items: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"\n");
  std::operator<<((ostream *)&std::cout,"  elapsed: ");
  poVar5 = std::ostream::_M_insert<double>((double)(lVar7 - lVar4) / 1000000.0);
  std::operator<<(poVar5," ms\n");
  poVar5 = std::operator<<((ostream *)&std::cout,"  result: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*result);
  std::operator<<(poVar5,"\n");
  pthread_mutex_unlock((pthread_mutex_t *)&iomutex);
  return;
}

Assistant:

void workload_unrollaccum8(const std::vector<float>& data, float& result) {
  auto t1 = hires_clock::now();
  if (data.size() % 8 != 0) {
    std::cerr
        << "ERROR in " << __func__ << ": data.size " << data.size() << "\n";
  }
  float rt0 = 0;
  float rt1 = 0;
  float rt2 = 0;
  float rt3 = 0;
  float rt4 = 0;
  float rt5 = 0;
  float rt6 = 0;
  float rt7 = 0;
  for (size_t i = 0; i < data.size(); i += 8) {
    rt0 += data[i];
    rt1 += data[i + 1];
    rt2 += data[i + 2];
    rt3 += data[i + 3];
    rt4 += data[i + 4];
    rt5 += data[i + 5];
    rt6 += data[i + 6];
    rt7 += data[i + 7];
  }
  result = rt0 + rt1 + rt2 + rt3 + rt4 + rt5 + rt6 + rt7;

  {
    auto t2 = hires_clock::now();
    std::lock_guard<std::mutex> iolock(iomutex);
    std::cout << __func__ << " [cpu " << sched_getcpu() << "]:\n";
    std::cout << "  processed items: " << data.size() << "\n";
    std::cout << "  elapsed: " << duration_ms(t2 - t1).count() << " ms\n";
    std::cout << "  result: " << result << "\n";
  }
}